

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void anon_unknown.dwarf_13465d::NumberDominanceGraphNodesDfs
               (VmBlock *block,uint *preOrder,uint *postOrder)

{
  uint uVar1;
  VmBlock *block_00;
  ulong uVar2;
  
  uVar1 = *preOrder;
  *preOrder = uVar1 + 1;
  block->dominanceGraphPreOrderId = uVar1;
  block->visited = true;
  if ((block->dominanceChildren).count != 0) {
    uVar2 = 0;
    do {
      block_00 = (block->dominanceChildren).data[uVar2];
      if (block_00->visited == false) {
        NumberDominanceGraphNodesDfs(block_00,preOrder,postOrder);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < (block->dominanceChildren).count);
  }
  uVar1 = *postOrder;
  *postOrder = uVar1 + 1;
  block->dominanceGraphPostOrderId = uVar1;
  return;
}

Assistant:

void NumberDominanceGraphNodesDfs(VmBlock* block, unsigned &preOrder, unsigned &postOrder)
	{
		block->dominanceGraphPreOrderId = preOrder++;

		block->visited = true;

		for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
		{
			VmBlock *child = block->dominanceChildren[i];

			if(!child->visited)
				NumberDominanceGraphNodesDfs(child, preOrder, postOrder);
		}

		block->dominanceGraphPostOrderId = postOrder++;
	}